

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::FieldDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  FieldDescriptor FVar1;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  FVar1 = this[0x50];
  if (FVar1 == (FieldDescriptor)0x1) {
    local_60.text_ = (char *)**(undefined8 **)(*(long *)(this + 0x58) + 8);
    local_60.size_ = *(int *)(*(undefined8 **)(*(long *)(this + 0x58) + 8) + 1);
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"extend .$0 {\n",&local_60,&local_90,&local_c0,&local_f0,
               &local_120,&local_150,&local_180,&local_1b0,&local_1e0,&local_210);
  }
  DebugString(this,(uint)(FVar1 == (FieldDescriptor)0x1),PRINT_LABEL,__return_storage_ptr__,
              debug_string_options);
  if (this[0x50] == (FieldDescriptor)0x1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  string contents;
  int depth = 0;
  if (is_extension()) {
    strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                 containing_type()->full_name());
    depth = 1;
  }
  DebugString(depth, PRINT_LABEL, &contents, debug_string_options);
  if (is_extension()) {
    contents.append("}\n");
  }
  return contents;
}